

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrayops.c
# Opt level: O3

LispPTR N_OP_misc4(LispPTR data,LispPTR base,LispPTR typenumber,LispPTR inx,int alpha)

{
  undefined4 uVar1;
  ulong uVar2;
  uint uVar3;
  DLword *pDVar4;
  uint uVar5;
  ulong uVar6;
  byte bVar7;
  uint uVar8;
  byte *pbVar9;
  
  if (alpha != 7) {
    MachineState.tosvalue = inx;
    MachineState.errorexit = 1;
    return 0xffffffff;
  }
  uVar2 = (ulong)base;
  uVar6 = (ulong)data;
  if ((inx & 0xfff0000) == 0xe0000) {
    uVar8 = inx & 0xffff;
  }
  else {
    if ((*(ushort *)((ulong)(inx >> 8 & 0xfffffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2) {
      MachineState.tosvalue = inx;
      MachineState.errorexit = 1;
      return 0xffffffff;
    }
    if ((inx & 1) != 0) {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n");
    }
    uVar8 = *(uint *)(Lisp_world + inx);
    if ((int)uVar8 < 0) {
      MachineState.tosvalue = inx;
      MachineState.errorexit = 1;
      return 0xffffffff;
    }
  }
  if ((typenumber & 0xfff0000) == 0xe0000) {
    uVar5 = typenumber & 0xffff;
  }
  else {
    if ((*(ushort *)((ulong)(typenumber >> 8 & 0xfffffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2) {
      MachineState.tosvalue = inx;
      MachineState.errorexit = 1;
      return 0xffffffff;
    }
    if ((typenumber & 1) != 0) {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n");
    }
    uVar5 = *(uint *)(Lisp_world + typenumber);
    if ((int)uVar5 < 0) {
      MachineState.tosvalue = inx;
      MachineState.errorexit = 1;
      return 0xffffffff;
    }
  }
  pDVar4 = MDStypetbl;
  uVar3 = data >> 8;
  if ((int)uVar5 < 0x26) {
    if ((int)uVar5 < 4) {
      if (uVar5 == 0) {
        if ((data & 0xfff0000) == 0xe0000) {
          uVar5 = data & 0xffff;
        }
        else {
          if ((*(ushort *)((ulong)(uVar3 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2) {
            MachineState.tosvalue = inx;
            MachineState.errorexit = 1;
            return 0xffffffff;
          }
          if ((data & 1) != 0) {
            printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar6);
          }
          uVar5 = *(uint *)(Lisp_world + uVar6);
          if ((int)uVar5 < 0) {
            MachineState.tosvalue = inx;
            MachineState.errorexit = 1;
            return 0xffffffff;
          }
        }
        if (uVar5 < 2) {
          pbVar9 = (byte *)((long)Lisp_world + (ulong)(uVar8 >> 3) + uVar2 * 2 ^ 3);
          bVar7 = *pbVar9;
          if (uVar5 == 0) {
            bVar7 = bVar7 & (char)(-1 << (~(byte)uVar8 & 7)) - 1U;
          }
          else {
            bVar7 = bVar7 | (byte)(1 << (~(byte)uVar8 & 7));
          }
          *pbVar9 = bVar7;
          return data;
        }
      }
      else {
        if (uVar5 != 3) {
          MachineState.tosvalue = inx;
          MachineState.errorexit = 1;
          return 0xffffffff;
        }
        if ((data & 0xfff0000) == 0xe0000) {
          uVar5 = data & 0xffff;
        }
        else {
          if ((*(ushort *)((ulong)(uVar3 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2) {
            MachineState.tosvalue = inx;
            MachineState.errorexit = 1;
            return 0xffffffff;
          }
          if ((data & 1) != 0) {
            printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar6);
          }
          uVar5 = *(uint *)(Lisp_world + uVar6);
          if ((int)uVar5 < 0) {
            MachineState.tosvalue = inx;
            MachineState.errorexit = 1;
            return 0xffffffff;
          }
        }
        if (uVar5 < 0x100) {
          *(char *)((long)Lisp_world + (ulong)uVar8 + uVar2 * 2 ^ 3) = (char)uVar5;
          return data;
        }
      }
    }
    else if (uVar5 == 4) {
      if ((data & 0xfff0000) == 0xe0000) {
LAB_00109175:
        *(short *)((ulong)(Lisp_world + uVar2 + uVar8) ^ 2) = (short)uVar6;
        return data;
      }
      if ((*(ushort *)((ulong)(uVar3 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff) == 2) {
        if ((data & 1) != 0) {
          printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar6);
        }
        uVar5 = *(uint *)(Lisp_world + uVar6);
        uVar6 = (ulong)uVar5;
        if ((-1 < (int)uVar5) && (uVar5 < 0x10000)) goto LAB_00109175;
      }
    }
    else if (uVar5 == 0x14) {
      if (((data & 0xfff8000) == 0xf8000) || ((data & 0xfff8000) == 0xe0000)) {
LAB_001091f8:
        *(short *)((ulong)(Lisp_world + uVar2 + uVar8) ^ 2) = (short)data;
        return data;
      }
    }
    else if (uVar5 == 0x16) {
      if ((data & 0xfff0000) == 0xf0000) {
        uVar5 = data | 0xffff0000;
      }
      else if ((data & 0xfff0000) == 0xe0000) {
        uVar5 = data & 0xffff;
      }
      else {
        if ((*(ushort *)((ulong)(uVar3 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2) {
          MachineState.tosvalue = inx;
          MachineState.errorexit = 1;
          return 0xffffffff;
        }
        if ((data & 1) != 0) {
          printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar6);
        }
        uVar5 = *(uint *)(Lisp_world + uVar6);
      }
      if ((base & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar2);
      }
      *(uint *)(Lisp_world + uVar2 + (ulong)uVar8 * 2) = uVar5;
      return data;
    }
  }
  else if ((int)uVar5 < 0x43) {
    if (uVar5 == 0x26) {
      if ((base & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n");
      }
      uVar6 = (ulong)uVar8;
      uVar8 = *(uint *)(Lisp_world + uVar2 + uVar6 * 2);
      if ((-1 < *(short *)((ulong)(pDVar4 + (uVar8 >> 9)) ^ 2)) && (*GcDisabled_word != 0x4c)) {
        if (*Reclaim_cnt_word == 0) {
          if ((base & 1) != 0) {
            printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar2);
            uVar8 = *(uint *)(Lisp_world + uVar2 + uVar6 * 2);
          }
          rec_htfind(uVar8,1);
        }
        else {
          if ((base & 1) != 0) {
            printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar2);
            uVar8 = *(uint *)(Lisp_world + uVar2 + uVar6 * 2);
          }
          htfind(uVar8,1);
        }
      }
      if ((-1 < *(short *)((ulong)(uVar3 & 0xfffffe) + (long)MDStypetbl ^ 2)) &&
         (*GcDisabled_word != 0x4c)) {
        if (*Reclaim_cnt_word == 0) {
          rec_htfind(data,0);
        }
        else {
          htfind(data,0);
        }
      }
      if ((base & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar2);
      }
      *(LispPTR *)(Lisp_world + uVar2 + uVar6 * 2) = data;
      return data;
    }
    if ((uVar5 == 0x36) &&
       ((*(ushort *)((ulong)(uVar3 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff) == 3)) {
      if ((data & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar6);
      }
      uVar1 = *(undefined4 *)(Lisp_world + uVar6);
      if ((base & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar2);
      }
      *(undefined4 *)(Lisp_world + uVar2 + (ulong)uVar8 * 2) = uVar1;
      return data;
    }
  }
  else if (uVar5 == 0x43) {
    if (((data & 0xfff0000) == 0x70000) && ((data & 0xff00) == 0)) {
      *(char *)((long)Lisp_world + (ulong)uVar8 + uVar2 * 2 ^ 3) = (char)data;
      return data;
    }
  }
  else if (uVar5 == 0x44) {
    if ((data & 0xfff0000) == 0x70000) goto LAB_001091f8;
  }
  else if (uVar5 == 0x56) {
    if ((base & 1) != 0) {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar2);
    }
    *(LispPTR *)(Lisp_world + uVar2 + (ulong)uVar8 * 2) = data;
    return data;
  }
  MachineState.errorexit = 1;
  MachineState.tosvalue = inx;
  return 0xffffffff;
}

Assistant:

LispPTR N_OP_misc4(LispPTR data, LispPTR base, LispPTR typenumber,
                   LispPTR inx, int alpha) {
  int index, type;

  if (alpha != 7) ERROR_EXIT(inx);

  /*  test and setup index  */
  N_GetPos(inx, index, inx);

  /*  test and setup typenumber  */
  N_GetPos(typenumber, type, inx);

  aset_switch(type, inx);

doufn:
  ERROR_EXIT(inx);

}